

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O3

optional<int> slang::parseInt<int>(string_view name,string_view value,string *error)

{
  ulong uVar1;
  _Optional_payload_base<int> _Var2;
  char *__first;
  ulong uVar3;
  size_t sVar4;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  in_R9;
  format_args args;
  format_args args_00;
  string_view fmt;
  string_view fmt_00;
  __integer_from_chars_result_type<int> _Var5;
  int val;
  uint local_7c;
  string local_78;
  string local_58;
  
  __first = value._M_str;
  sVar4 = value._M_len;
  if (sVar4 == 0) {
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)&local_78;
    fmt.size_ = 0xd;
    fmt.data_ = (char *)0x20;
    local_78._M_dataplus._M_p = name._M_str;
    local_78._M_string_length = name._M_len;
    ::fmt::v9::vformat_abi_cxx11_(&local_58,(v9 *)"expected value for argument \'{}\'",fmt,args);
    std::__cxx11::string::operator=((string *)error,(string *)&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
    _Var2._M_payload = (_Storage<int,_true>)0x0;
    _Var2._M_engaged = false;
    _Var2._5_3_ = 0;
  }
  else {
    _Var5 = std::from_chars<int>(__first,__first + sVar4,(int *)&local_7c,10);
    if (_Var5.ec == 0 && _Var5.ptr == __first + sVar4) {
      uVar1 = (ulong)local_7c;
      uVar3 = 0x100000000;
    }
    else {
      args_00.field_1.values_ = in_R9.values_;
      args_00.desc_ = (unsigned_long_long)&local_58;
      fmt_00.size_ = 0xdd;
      fmt_00.data_ = (char *)0x2c;
      local_58._M_dataplus._M_p = __first;
      local_58._M_string_length = sVar4;
      local_58.field_2._M_allocated_capacity = (size_type)name._M_str;
      local_58.field_2._8_8_ = name._M_len;
      ::fmt::v9::vformat_abi_cxx11_
                (&local_78,(v9 *)"invalid value \'{}\' for integer argument \'{}\'",fmt_00,args_00);
      std::__cxx11::string::operator=((string *)error,(string *)&local_78);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      uVar1 = 0;
      uVar3 = 0;
    }
    _Var2 = (_Optional_payload_base<int>)(uVar1 | uVar3);
  }
  return (optional<int>)_Var2;
}

Assistant:

static std::optional<T> parseInt(string_view name, string_view value, std::string& error) {
    if (value.empty()) {
        error = fmt::format("expected value for argument '{}'", name);
        return {};
    }

    T val;
    auto end = value.data() + value.size();
    auto result = std::from_chars(value.data(), end, val);
    if (result.ec != std::errc() || result.ptr != end) {
        error = fmt::format("invalid value '{}' for integer argument '{}'", value, name);
        return {};
    }

    return val;
}